

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void __thiscall
flatbuffers::ToStringVisitor::Named<unsigned_int>(ToStringVisitor *this,uint x,char *name)

{
  string sStack_38;
  
  if (name == (char *)0x0) {
    NumToString<unsigned_int>(&sStack_38,x);
    std::__cxx11::string::append((string *)&this->s);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    if (this->q == true) {
      std::__cxx11::string::append((char *)&this->s);
    }
    std::__cxx11::string::append((char *)&this->s);
    if (this->q == true) {
      std::__cxx11::string::append((char *)&this->s);
      return;
    }
  }
  return;
}

Assistant:

void Named(T x, const char *name) {
    if (name) {
      if (q) s += "\"";
      s += name;
      if (q) s += "\"";
    } else {
      s += NumToString(x);
    }
  }